

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

bool __thiscall
duckdb::DoubleToVarInt<float>(duckdb *this,float double_value,string_t *result_value,Vector *result)

{
  double dVar1;
  reference pvVar2;
  Vector *extraout_RDX;
  Vector *extraout_RDX_00;
  Vector *pVVar3;
  ulong uVar4;
  pointer __n;
  char *blob;
  Vector *vector;
  anon_struct_16_3_d7536bce_for_pointer aVar5;
  byte local_79;
  anon_union_16_2_67f50693_for_value *local_78;
  double local_70;
  vector<char,_true> value;
  
  if ((uint)ABS(double_value) < 0x7f800000) {
    local_78 = (anon_union_16_2_67f50693_for_value *)this;
    if ((double_value != 0.0) || (NAN(double_value))) {
      value.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      value.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      value.super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      dVar1 = (double)ABS(double_value);
      while (0.0 < dVar1) {
        local_70 = floor(dVar1 * 0.00390625);
        local_79 = (byte)(int)(local_70 * -256.0 + dVar1);
        if (0.0 <= double_value) {
          ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&value.super_vector<char,_std::allocator<char>_>,(char *)&local_79);
          result = extraout_RDX_00;
          dVar1 = local_70;
        }
        else {
          local_79 = ~local_79;
          ::std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    (&value.super_vector<char,_std::allocator<char>_>,(char *)&local_79);
          result = extraout_RDX;
          dVar1 = local_70;
        }
      }
      uVar4 = (long)value.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)value.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start;
      vector = (Vector *)(ulong)((int)uVar4 + 3);
      aVar5 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::EmptyString((StringVector *)result_value,vector,(idx_t)result);
      local_78->pointer = aVar5;
      blob = (local_78->pointer).prefix;
      if (0xc < aVar5.length) {
        blob = aVar5.ptr;
      }
      Varint::SetHeader(blob,uVar4 & 0xffffffff,double_value < 0.0);
      __n = value.super_vector<char,_std::allocator<char>_>.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish +
            ~(ulong)value.super_vector<char,_std::allocator<char>_>.
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                    _M_start;
      for (pVVar3 = (Vector *)0x3; pVVar3 < vector; pVVar3 = (Vector *)&pVVar3->field_0x1) {
        pvVar2 = vector<char,_true>::get<true>(&value,(size_type)__n);
        blob[(long)pVVar3] = *pvVar2;
        __n = __n + -1;
      }
      string_t::Finalize((string_t *)&local_78->pointer);
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&value);
    }
    else {
      aVar5 = (anon_struct_16_3_d7536bce_for_pointer)
              Varint::InitializeVarintZero((Vector *)result_value);
      local_78->pointer = aVar5;
    }
  }
  return (uint)ABS(double_value) < 0x7f800000;
}

Assistant:

bool DoubleToVarInt(T double_value, string_t &result_value, Vector &result) {
	// Check if we can cast it
	if (!std::isfinite(double_value)) {
		// We can't cast inf -inf nan
		return false;
	}
	// Determine if the number is negative
	bool is_negative = double_value < 0;
	// Determine the number of data bytes
	double abs_value = std::abs(double_value);

	if (abs_value == 0) {
		// Return Value 0
		result_value = Varint::InitializeVarintZero(result);
		return true;
	}
	vector<char> value;
	while (abs_value > 0) {
		double quotient = abs_value / 256;
		double truncated = floor(quotient);
		uint8_t byte = static_cast<uint8_t>(abs_value - truncated * 256);
		abs_value = truncated;
		if (is_negative) {
			value.push_back(static_cast<char>(~byte));
		} else {
			value.push_back(static_cast<char>(byte));
		}
	}
	uint32_t data_byte_size = static_cast<uint32_t>(value.size());
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	result_value = StringVector::EmptyString(result, blob_size);
	auto writable_blob = result_value.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);
	// Add data bytes to the blob, starting off after header bytes
	idx_t blob_string_idx = value.size() - 1;
	for (idx_t i = Varint::VARINT_HEADER_SIZE; i < blob_size; i++) {
		writable_blob[i] = value[blob_string_idx--];
	}
	result_value.Finalize();
	return true;
}